

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

uint64_t sum_quotients<short,libdivide::divider<short,(libdivide::Branching)0>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  
  uVar4 = 0;
  if ((ulong)vals->_length != 0) {
    sVar2 = (div->div).denom.magic;
    bVar1 = (div->div).denom.more;
    bVar8 = bVar1 & 0x1f;
    uVar9 = 0xffff;
    if (-1 < (char)bVar1) {
      uVar9 = 0;
    }
    uVar5 = 0;
    do {
      uVar3 = *(ushort *)((long)vals->_pData + uVar4);
      if (sVar2 == 0) {
        iVar7 = ((int)(short)(((ushort)((uint)(int)(short)uVar3 >> 0xf) & ~(ushort)(-1 << bVar8)) +
                             uVar3) >> bVar8 ^ uVar9) - uVar9;
      }
      else {
        uVar6 = (uint)((int)(short)uVar3 * (int)sVar2) >> 0x10;
        uVar10 = (uVar6 - (int)((char)bVar1 >> 7)) + ((uint)uVar3 ^ (int)((char)bVar1 >> 7));
        if ((bVar1 & 0x40) == 0) {
          uVar10 = uVar6;
        }
        iVar7 = ((int)(short)uVar10 >> bVar8) - ((int)(uVar10 << 0x10) >> 0x1f);
      }
      uVar5 = uVar5 + iVar7;
      uVar4 = uVar4 + 2;
    } while ((ulong)vals->_length * 2 != uVar4);
    uVar4 = (uint64_t)(uVar5 & 0xffff);
  }
  return uVar4;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}